

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

int resolve_amb_greedy(D_Parser *dp,int n,D_ParseNode **v)

{
  int iVar1;
  PNode *y;
  int iVar2;
  ulong uVar3;
  PNode *x;
  ulong uVar4;
  
  uVar3 = 0;
  for (uVar4 = 1; iVar2 = (int)uVar3, (long)uVar4 < (long)n; uVar4 = uVar4 + 1) {
    x = (PNode *)(v[uVar4] + -2);
    if (v[uVar4] == (D_ParseNode *)0x0) {
      x = (PNode *)0x0;
    }
    y = (PNode *)(v[iVar2] + -2);
    if (v[iVar2] == (D_ParseNode *)0x0) {
      y = (PNode *)0x0;
    }
    iVar1 = cmp_greediness((Parser *)dp,x,y);
    if ((iVar1 < 0) ||
       ((iVar1 == 0 && (*(uint *)&v[uVar4][-2].start_loc.ws < *(uint *)&v[iVar2][-2].start_loc.ws)))
       ) {
      uVar3 = uVar4 & 0xffffffff;
    }
  }
  return iVar2;
}

Assistant:

int resolve_amb_greedy(D_Parser *dp, int n, D_ParseNode **v) {
  int i, result, selected_node = 0;

  for (i = 1; i < n; i++) {
    result = cmp_greediness((Parser *)dp, D_ParseNode_to_PNode(v[i]), D_ParseNode_to_PNode(v[selected_node]));
    if (result < 0 ||
        (result == 0 && D_ParseNode_to_PNode(v[i])->height < D_ParseNode_to_PNode(v[selected_node])->height))
      selected_node = i;
  }
  return selected_node;
}